

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenFunctionRef BinaryenGetFunctionByIndex(BinaryenModuleRef module,BinaryenIndex index)

{
  size_type sVar1;
  const_reference this;
  pointer pFVar2;
  Fatal local_1a8;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *local_20;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *functions;
  BinaryenModuleRef pMStack_10;
  BinaryenIndex index_local;
  BinaryenModuleRef module_local;
  
  local_20 = &module->functions;
  functions._4_4_ = index;
  pMStack_10 = module;
  sVar1 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::size(local_20);
  if (sVar1 <= functions._4_4_) {
    wasm::Fatal::Fatal(&local_1a8);
    wasm::Fatal::operator<<(&local_1a8,(char (*) [24])"invalid function index.");
    wasm::Fatal::~Fatal(&local_1a8);
  }
  this = std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::operator[](local_20,(ulong)functions._4_4_);
  pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this);
  return pFVar2;
}

Assistant:

BinaryenFunctionRef BinaryenGetFunctionByIndex(BinaryenModuleRef module,
                                               BinaryenIndex index) {
  const auto& functions = ((Module*)module)->functions;
  if (functions.size() <= index) {
    Fatal() << "invalid function index.";
  }
  return functions[index].get();
}